

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,static_string_view keyword,cmExpandedCommandArgument *argument
          )

{
  size_t __n;
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  cmListFileContext *context;
  ostream *poVar5;
  cmake *this_01;
  PolicyID id;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  if ((WARN < this->Policy54Status) &&
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), bVar1)) {
    return false;
  }
  psVar4 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
  __n = psVar4->_M_string_length;
  if (__n == keyword.super_string_view._M_len) {
    if (__n == 0) {
      bVar1 = true;
    }
    else {
      iVar3 = bcmp((psVar4->_M_dataplus)._M_p,keyword.super_string_view._M_str,__n);
      bVar1 = iVar3 == 0;
    }
  }
  else {
    bVar1 = false;
  }
  if (((bVar1 != false) && (bVar2 = cmExpandedCommandArgument::WasQuoted(argument), bVar2)) &&
     (this->Policy54Status == WARN)) {
    this_00 = this->Makefile;
    context = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                        (&(this->Backtrace).
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    bVar2 = cmMakefile::HasCMP0054AlreadyBeenReported(this_00,context);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x36,id);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nQuoted keywords like \"",0x17);
      psVar4 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                 ,0x86);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_1c0,&this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    }
  }
  return bVar1;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(
  cm::static_string_view keyword,
  const cmExpandedCommandArgument& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return false;
  }

  const auto isKeyword = argument.GetValue() == keyword;

  if (isKeyword && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(this->Backtrace.Top())) {
      std::ostringstream e;
      // clang-format off
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054)
        << "\n"
           "Quoted keywords like \"" << argument.GetValue() << "\" "
           "will no longer be interpreted as keywords "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";
      // clang-format on

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return isKeyword;
}